

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_trace_diag_avx2_256_64.c
# Opt level: O2

parasail_result_t *
parasail_sw_trace_diag_avx2_256_64
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  __m256i *__return_storage_ptr__;
  int *piVar1;
  __m256i *palVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  ulong uVar5;
  __m256i a;
  __m256i a_00;
  __m256i a_01;
  __m256i a_02;
  __m256i a_03;
  __m256i a_04;
  __m256i b;
  __m256i b_00;
  __m256i b_01;
  __m256i b_02;
  __m256i b_03;
  __m256i b_04;
  undefined1 auVar6 [32];
  parasail_result_t *ppVar7;
  int64_t *ptr;
  int64_t *piVar8;
  int64_t *ptr_00;
  uint uVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  int64_t iVar13;
  char *pcVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  char *__format;
  uint uVar21;
  __m256i *__return_storage_ptr___00;
  long lVar22;
  int iVar23;
  int64_t iVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  long lVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [32];
  undefined1 in_ZMM8 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  long lVar56;
  long lVar57;
  long lVar58;
  long lVar59;
  undefined1 auVar60 [32];
  undefined8 in_stack_fffffffffffffb60;
  int64_t *ptr_01;
  int64_t *ptr_02;
  long lVar61;
  undefined1 local_3a0 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  long local_2e0;
  long lStack_2d8;
  long lStack_2c8;
  undefined1 local_2a0 [32];
  long local_280;
  long lStack_278;
  long lStack_270;
  long lStack_268;
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  long local_220;
  long lStack_218;
  long lStack_210;
  long lStack_208;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong local_1a0;
  ulong uStack_198;
  ulong uStack_190;
  ulong uStack_188;
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [2] [32];
  int64_t iVar17;
  
  if (_s2 == (char *)0x0) {
    __format = "%s: missing %s\n";
    pcVar14 = "_s2";
  }
  else {
    uVar26 = (ulong)(uint)s2Len;
    if (s2Len < 1) {
      __format = "%s: %s must be > 0\n";
      pcVar14 = "s2Len";
    }
    else if (open < 0) {
      __format = "%s: %s must be >= 0\n";
      pcVar14 = "open";
    }
    else if (gap < 0) {
      __format = "%s: %s must be >= 0\n";
      pcVar14 = "gap";
    }
    else if (matrix == (parasail_matrix_t *)0x0) {
      __format = "%s: missing %s\n";
      pcVar14 = "matrix";
    }
    else {
      if (matrix->type != 0) {
        _s1Len = matrix->length;
LAB_00802824:
        iVar10 = matrix->min;
        uVar5 = CONCAT44(0,open);
        uVar16 = 0x8000000000000000 - (long)iVar10;
        if (iVar10 != -open && SBORROW4(iVar10,-open) == iVar10 + open < 0) {
          uVar16 = uVar5 | 0x8000000000000000;
        }
        iVar10 = matrix->max;
        ppVar7 = parasail_result_new_trace(_s1Len,s2Len,0x20,1);
        if (ppVar7 != (parasail_result_t *)0x0) {
          ppVar7->flag = ppVar7->flag | 0x4881004;
          uVar20 = (ulong)(s2Len + 6);
          ptr = parasail_memalign_int64_t(0x20,uVar20);
          piVar8 = parasail_memalign_int64_t(0x20,uVar20);
          ptr_00 = parasail_memalign_int64_t(0x20,uVar20);
          if (ptr_00 != (int64_t *)0x0 && (piVar8 != (int64_t *)0x0 && ptr != (int64_t *)0x0)) {
            lVar28 = (long)_s1Len;
            uVar15 = _s1Len;
            if (matrix->type == 0) {
              ptr_01 = parasail_memalign_int64_t(0x20,(long)(int)(_s1Len + 3));
              if (ptr_01 == (int64_t *)0x0) {
                return (parasail_result_t *)0x0;
              }
              for (uVar20 = 0; lVar11 = lVar28, (uint)(~(_s1Len >> 0x1f) & _s1Len) != uVar20;
                  uVar20 = uVar20 + 1) {
                ptr_01[uVar20] = (long)matrix->mapper[(byte)_s1[uVar20]];
              }
              for (; lVar11 < (int)(_s1Len + 3); lVar11 = lVar11 + 1) {
                ptr_01[lVar11] = 0;
              }
            }
            else {
              ptr_01 = (int64_t *)0x0;
            }
            uVar21 = s2Len + 3;
            lVar11 = uVar16 + 1;
            local_280 = 0x7ffffffffffffffe - (long)iVar10;
            local_320._8_8_ = lVar11;
            local_320._0_8_ = lVar11;
            local_320._16_8_ = lVar11;
            local_320._24_8_ = lVar11;
            auVar52 = ZEXT3264(local_320);
            lStack_278 = local_280;
            lStack_270 = local_280;
            lStack_268 = local_280;
            local_200 = vpblendd_avx2(local_320,SUB6432(ZEXT1664((undefined1  [16])0x0),0),0xc0);
            auVar30._4_4_ = 0;
            auVar30._0_4_ = gap;
            auVar30._8_4_ = gap;
            auVar30._12_4_ = 0;
            auVar30._16_4_ = gap;
            auVar30._20_4_ = 0;
            auVar30._24_4_ = gap;
            auVar30._28_4_ = 0;
            local_220 = lVar28;
            lStack_218 = lVar28;
            lStack_210 = lVar28;
            lStack_208 = lVar28;
            local_1a0 = uVar26;
            uStack_198 = uVar26;
            uStack_190 = uVar26;
            uStack_188 = uVar26;
            piVar1 = matrix->mapper;
            for (uVar16 = 0; uVar26 != uVar16; uVar16 = uVar16 + 1) {
              ptr[uVar16 + 3] = (long)piVar1[(byte)_s2[uVar16]];
            }
            for (lVar12 = 0; uVar16 = uVar26, lVar12 != 3; lVar12 = lVar12 + 1) {
              ptr[lVar12] = 0;
            }
            for (; (int)uVar16 < (int)uVar21; uVar16 = uVar16 + 1) {
              ptr[uVar16 + 3] = 0;
            }
            for (uVar16 = 0; uVar26 != uVar16; uVar16 = uVar16 + 1) {
              piVar8[uVar16 + 3] = 0;
              ptr_00[uVar16 + 3] = lVar11;
            }
            for (lVar12 = 0; uVar16 = uVar26, lVar12 != 3; lVar12 = lVar12 + 1) {
              piVar8[lVar12] = lVar11;
              ptr_00[lVar12] = lVar11;
            }
            for (; (int)uVar16 < (int)uVar21; uVar16 = uVar16 + 1) {
              piVar8[uVar16 + 3] = lVar11;
              ptr_00[uVar16 + 3] = lVar11;
            }
            uVar16 = (ulong)(uVar15 - 1);
            lVar12 = uVar26 * 2 + -2;
            local_3a0._8_8_ = 2;
            local_3a0._0_8_ = 3;
            local_3a0._16_8_ = 1;
            local_3a0._24_8_ = 0;
            lVar61 = 0;
            auVar51 = ZEXT3264(local_320);
            auVar54 = ZEXT3264(local_320);
            auVar55 = ZEXT3264(local_320);
            local_300._8_8_ = local_280;
            local_300._0_8_ = local_280;
            local_300._16_8_ = local_280;
            local_300._24_8_ = local_280;
            local_260 = local_320;
            ptr_02 = piVar8;
            for (uVar20 = 0; auVar33 = auVar52._0_32_, (long)uVar20 < lVar28; uVar20 = uVar20 + 4) {
              uVar25 = uVar20 | 2;
              if (matrix->type == 0) {
                uVar19 = ptr_01[uVar20];
                iVar24 = ptr_01[uVar20 + 1];
                iVar13 = ptr_01[uVar25];
                iVar17 = ptr_01[uVar20 + 3];
              }
              else {
                uVar18 = (uint)uVar16;
                uVar15 = (uint)uVar20;
                uVar9 = uVar18;
                if ((long)(uVar20 | 1) < lVar28) {
                  uVar9 = uVar15 | 1;
                }
                iVar24 = (int64_t)(int)uVar9;
                uVar9 = uVar15 | 2;
                if (lVar28 <= (long)uVar25) {
                  uVar9 = uVar18;
                }
                iVar13 = (int64_t)(int)uVar9;
                uVar15 = uVar15 | 3;
                if (lVar28 <= (long)(uVar20 | 3)) {
                  uVar15 = uVar18;
                }
                iVar17 = (int64_t)(int)uVar15;
                uVar19 = uVar20;
              }
              palVar2 = (__m256i *)matrix->matrix;
              lVar22 = (long)matrix->size;
              __return_storage_ptr__ = (__m256i *)((long)*palVar2 + iVar17 * lVar22 * 4);
              auVar31._8_8_ = lStack_218;
              auVar31._0_8_ = local_220;
              auVar31._16_8_ = lStack_210;
              auVar31._24_8_ = lStack_208;
              local_180 = vpcmpgtq_avx2(auVar31,local_3a0);
              uVar27 = 0;
              auVar4 = vpmovsxbq_avx2(ZEXT416(0xfffefd));
              __return_storage_ptr___00 = palVar2;
              auVar40 = local_200;
              auVar31 = auVar33;
              auVar34 = local_200;
              for (; auVar53 = in_ZMM8._0_32_, (~((int)uVar21 >> 0x1f) & uVar21) != uVar27;
                  uVar27 = uVar27 + 1) {
                local_c0 = auVar55._0_32_;
                local_a0 = auVar54._0_32_;
                auVar32 = vpermq_avx2(auVar34,0xf9);
                iVar17 = piVar8[uVar27 + 3];
                auVar41._8_8_ = iVar17;
                auVar41._0_8_ = iVar17;
                auVar41._16_8_ = iVar17;
                auVar41._24_8_ = iVar17;
                local_e0 = vpblendd_avx2(auVar32,auVar41,0xc0);
                auVar31 = vpermq_avx2(auVar31,0xf9);
                iVar17 = ptr_00[uVar27 + 3];
                auVar37._8_8_ = iVar17;
                auVar37._0_8_ = iVar17;
                auVar37._16_8_ = iVar17;
                auVar37._24_8_ = iVar17;
                auVar32 = vpblendd_avx2(auVar31,auVar37,0xc0);
                auVar3._8_4_ = open;
                auVar3._0_8_ = uVar5;
                auVar3._12_4_ = 0;
                auVar3._16_4_ = open;
                auVar3._20_4_ = 0;
                auVar3._24_4_ = open;
                auVar3._28_4_ = 0;
                auVar31 = vpsubq_avx2(local_e0,auVar3);
                local_120 = vpsubq_avx2(auVar32,auVar30);
                a[1] = (longlong)ptr;
                a[0] = in_stack_fffffffffffffb60;
                a[2] = (longlong)ptr_01;
                a[3] = uVar16;
                b[1] = (longlong)ptr_02;
                b[0] = lVar11;
                b[2] = lVar12;
                b[3] = lVar61;
                local_100 = auVar31;
                _mm256_max_epi64_rpl(__return_storage_ptr___00,a,b);
                auVar32._8_4_ = open;
                auVar32._0_8_ = uVar5;
                auVar32._12_4_ = 0;
                auVar32._16_4_ = open;
                auVar32._20_4_ = 0;
                auVar32._24_4_ = open;
                auVar32._28_4_ = 0;
                auVar32 = vpsubq_avx2(auVar34,auVar32);
                local_160 = vpsubq_avx2(auVar33,auVar30);
                a_00[1] = (longlong)ptr;
                a_00[0] = in_stack_fffffffffffffb60;
                a_00[2] = (longlong)ptr_01;
                a_00[3] = uVar16;
                b_00[1] = (longlong)ptr_02;
                b_00[0] = lVar11;
                b_00[2] = lVar12;
                b_00[3] = lVar61;
                local_140 = auVar32;
                _mm256_max_epi64_rpl(__return_storage_ptr___00,a_00,b_00);
                auVar29._8_8_ = 0;
                auVar29._0_8_ =
                     (long)*(int *)((long)*palVar2 + ptr[uVar27 + 3] * 4 + uVar19 * lVar22 * 4);
                auVar35._8_8_ = 0;
                auVar35._0_8_ =
                     (long)*(int *)((long)*palVar2 + ptr[uVar27 + 2] * 4 + iVar24 * lVar22 * 4);
                auVar29 = vpunpcklqdq_avx(auVar35,auVar29);
                auVar36._8_8_ = 0;
                auVar36._0_8_ =
                     (long)*(int *)((long)*palVar2 + ptr[uVar27 + 1] * 4 + iVar13 * lVar22 * 4);
                auVar39._8_8_ = 0;
                auVar39._0_8_ = (long)*(int *)((long)*__return_storage_ptr__ + ptr[uVar27] * 4);
                auVar35 = vpunpcklqdq_avx(auVar39,auVar36);
                auVar33._0_16_ = ZEXT116(0) * auVar29 + ZEXT116(1) * auVar35;
                auVar33._16_16_ = ZEXT116(1) * auVar29;
                auVar33 = vpaddq_avx2(auVar33,auVar40);
                a_01[1] = (longlong)ptr;
                a_01[0] = in_stack_fffffffffffffb60;
                a_01[2] = (longlong)ptr_01;
                a_01[3] = uVar16;
                b_01[1] = (longlong)ptr_02;
                b_01[0] = lVar11;
                b_01[2] = lVar12;
                b_01[3] = lVar61;
                __return_storage_ptr___00 = __return_storage_ptr__;
                _mm256_max_epi64_rpl(__return_storage_ptr__,a_01,b_01);
                a_02[1] = (longlong)ptr;
                a_02[0] = in_stack_fffffffffffffb60;
                a_02[2] = (longlong)ptr_01;
                a_02[3] = uVar16;
                b_02[1] = (longlong)ptr_02;
                b_02[0] = lVar11;
                b_02[2] = lVar12;
                b_02[3] = lVar61;
                auVar40 = auVar33;
                _mm256_max_epi64_rpl(__return_storage_ptr___00,a_02,b_02);
                a_03[1] = (longlong)ptr;
                a_03[0] = in_stack_fffffffffffffb60;
                a_03[2] = (longlong)ptr_01;
                a_03[3] = uVar16;
                b_03[1] = (longlong)ptr_02;
                b_03[0] = lVar11;
                b_03[2] = lVar12;
                b_03[3] = lVar61;
                _mm256_max_epi64_rpl(__return_storage_ptr___00,a_03,b_03);
                auVar60._0_8_ = -(ulong)(auVar4._0_8_ == -1);
                auVar60._8_8_ = -(ulong)(auVar4._8_8_ == -1);
                auVar60._16_8_ = -(ulong)(auVar4._16_8_ == -1);
                auVar60._24_8_ = -(ulong)(auVar4._24_8_ == -1);
                auVar34 = vpandn_avx2(auVar60,auVar40);
                piVar8 = ptr_02;
                if (3 < uVar27) {
                  auVar3 = vpcmpgtq_avx2(auVar34,local_300);
                  local_300 = vblendvpd_avx(auVar34,local_300,auVar3);
                  a_04[1] = (longlong)ptr;
                  a_04[0] = in_stack_fffffffffffffb60;
                  a_04[2] = (longlong)ptr_01;
                  a_04[3] = uVar16;
                  b_04[1] = (longlong)ptr_02;
                  b_04[0] = lVar11;
                  b_04[2] = lVar12;
                  b_04[3] = lVar61;
                  local_1e0 = auVar40;
                  local_1c0 = auVar60;
                  _mm256_max_epi64_rpl(__return_storage_ptr___00,a_04,b_04);
                  auVar40 = local_1e0;
                  auVar60 = local_1c0;
                  piVar8 = ptr_02;
                }
                auVar52 = ZEXT3264(local_260);
                auVar31 = vblendvpd_avx(auVar31,local_260,auVar60);
                local_2e0 = auVar33._0_8_;
                lVar56 = auVar34._0_8_;
                auVar38._0_8_ = -(ulong)(lVar56 == local_2e0);
                lStack_2d8 = auVar33._8_8_;
                lVar57 = auVar34._8_8_;
                auVar38._8_8_ = -(ulong)(lVar57 == lStack_2d8);
                lVar58 = auVar34._16_8_;
                auVar38._16_8_ = -(ulong)(lVar58 == auVar33._16_8_);
                lStack_2c8 = auVar33._24_8_;
                lVar59 = auVar34._24_8_;
                auVar38._24_8_ = -(ulong)(lVar59 == lStack_2c8);
                auVar42._0_8_ = -(ulong)(lVar56 == auVar31._0_8_);
                auVar42._8_8_ = -(ulong)(lVar57 == auVar31._8_8_);
                auVar42._16_8_ = -(ulong)(lVar58 == auVar31._16_8_);
                auVar42._24_8_ = -(ulong)(lVar59 == auVar31._24_8_);
                auVar43._8_8_ = 1;
                auVar43._0_8_ = 1;
                auVar43._16_8_ = 1;
                auVar43._24_8_ = 1;
                auVar3 = vpsubq_avx2(auVar43,auVar42);
                auVar44._0_8_ = -(ulong)(lVar56 == 0);
                auVar44._8_8_ = -(ulong)(lVar57 == 0);
                auVar44._16_8_ = -(ulong)(lVar58 == 0);
                auVar44._24_8_ = -(ulong)(lVar59 == 0);
                auVar46._8_8_ = 4;
                auVar46._0_8_ = 4;
                auVar46._16_8_ = 4;
                auVar46._24_8_ = 4;
                auVar33 = vpandn_avx2(auVar44,auVar46);
                auVar33 = vblendvpd_avx(auVar3,auVar33,auVar38);
                auVar3 = vpcmpgtq_avx2(local_140,local_160);
                auVar37 = vpcmpgtq_avx2(local_100,local_120);
                auVar47._8_8_ = 8;
                auVar47._0_8_ = 8;
                auVar47._16_8_ = 8;
                auVar47._24_8_ = 8;
                auVar49._8_8_ = 0x10;
                auVar49._0_8_ = 0x10;
                auVar49._16_8_ = 0x10;
                auVar49._24_8_ = 0x10;
                auVar3 = vblendvpd_avx(auVar49,auVar47,auVar3);
                auVar48._8_8_ = 0x20;
                auVar48._0_8_ = 0x20;
                auVar48._16_8_ = 0x20;
                auVar48._24_8_ = 0x20;
                auVar50._8_8_ = 0x40;
                auVar50._0_8_ = 0x40;
                auVar50._16_8_ = 0x40;
                auVar50._24_8_ = 0x40;
                auVar37 = vblendvpd_avx(auVar50,auVar48,auVar37);
                auVar3 = vorpd_avx(auVar37,auVar3);
                auVar33 = vorpd_avx(auVar3,auVar33);
                piVar1 = ((ppVar7->field_4).rowcols)->score_row;
                if (uVar27 < uVar26) {
                  *(char *)((long)piVar1 + uVar27 + lVar61) = auVar33[0x10];
                }
                if (uVar27 - 1 < uVar26 && (long)(uVar20 | 1) < lVar28) {
                  *(char *)((long)piVar1 + uVar27 + (uVar20 | 1) * uVar26 + -1) = auVar33[0x10];
                }
                if (((long)uVar25 < lVar28) && ((long)(uVar27 - 2) < (long)uVar26 && 1 < uVar27)) {
                  *(char *)((long)piVar1 + uVar27 + lVar12) = auVar33[0];
                }
                if (2 < uVar27 && (long)(uVar20 | 3) < lVar28) {
                  *(char *)((long)piVar1 + uVar27 + (uVar20 | 3) * uVar26 + -3) = auVar33[0];
                }
                auVar37 = vpcmpeqd_avx2(auVar53,auVar53);
                in_ZMM8 = ZEXT3264(auVar37);
                auVar53 = vpcmpgtq_avx2(auVar4,auVar37);
                auVar6._8_8_ = uStack_198;
                auVar6._0_8_ = local_1a0;
                auVar6._16_8_ = uStack_190;
                auVar6._24_8_ = uStack_188;
                auVar33 = vpcmpgtq_avx2(auVar6,auVar4);
                auVar33 = vpand_avx2(auVar33,local_180);
                auVar53 = vpand_avx2(auVar33,auVar53);
                auVar29 = vpackssdw_avx(auVar53._0_16_,auVar53._16_16_);
                auVar45._0_8_ = -(ulong)(lVar56 == local_c0._0_8_);
                auVar45._8_8_ = -(ulong)(lVar57 == local_c0._8_8_);
                auVar45._16_8_ = -(ulong)(lVar58 == local_c0._16_8_);
                auVar45._24_8_ = -(ulong)(lVar59 == local_c0._24_8_);
                auVar41 = vpcmpgtq_avx2(auVar34,local_c0);
                auVar3 = vpand_avx2(auVar41,auVar53);
                auVar33 = vblendvpd_avx(local_c0,auVar40,auVar3);
                auVar55 = ZEXT3264(auVar33);
                auVar35 = vpackssdw_avx(auVar3._0_16_,auVar3._16_16_);
                auVar33 = vpcmpgtq_avx2(local_a0,auVar4);
                auVar3 = vpand_avx2(auVar45,auVar33);
                auVar36 = vpackssdw_avx(auVar3._0_16_,auVar3._16_16_);
                auVar29 = vblendvps_avx(auVar35,auVar29,auVar36);
                auVar33 = vblendvpd_avx(auVar32,local_260,auVar60);
                auVar40 = vpmovsxdq_avx2(auVar29);
                auVar40 = vblendvpd_avx(auVar51._0_32_,local_3a0,auVar40);
                auVar51 = ZEXT3264(auVar40);
                auVar40 = vpor_avx2(auVar3,auVar41);
                auVar40 = vpand_avx2(auVar53,auVar40);
                auVar40 = vblendvpd_avx(local_a0,auVar4,auVar40);
                auVar54 = ZEXT3264(auVar40);
                piVar8[uVar27] = lVar56;
                ptr_00[uVar27] = auVar31._0_8_;
                auVar4 = vpsubq_avx2(auVar4,auVar37);
                auVar40 = local_e0;
                ptr_02 = piVar8;
              }
              auVar34._8_8_ = 4;
              auVar34._0_8_ = 4;
              auVar34._16_8_ = 4;
              auVar34._24_8_ = 4;
              local_3a0 = vpaddq_avx2(local_3a0,auVar34);
              lVar12 = lVar12 + uVar26 * 4;
              lVar61 = lVar61 + uVar26 * 4;
            }
            local_80[0] = auVar55._0_32_;
            local_240 = auVar54._0_32_;
            local_2a0 = auVar51._0_32_;
            iVar23 = 0;
            iVar10 = 0;
            for (lVar28 = 0; (int)lVar28 != 4; lVar28 = lVar28 + 1) {
              lVar12 = *(long *)(local_80[0] + lVar28 * 8);
              if (lVar11 < lVar12) {
                iVar10 = *(int *)(local_2a0 + lVar28 * 8);
                lVar11 = lVar12;
                iVar23 = *(int *)(local_240 + lVar28 * 8);
              }
              else if (lVar12 == lVar11) {
                lVar12 = *(long *)(local_240 + lVar28 * 8);
                if (lVar12 < iVar23) {
                  iVar10 = *(int *)(local_2a0 + lVar28 * 8);
                  iVar23 = (int)lVar12;
                }
                else if ((lVar12 == iVar23) && (*(long *)(local_2a0 + lVar28 * 8) < (long)iVar10)) {
                  iVar10 = (int)*(long *)(local_2a0 + lVar28 * 8);
                  iVar23 = (int)lVar12;
                }
              }
            }
            auVar30 = vpcmpgtq_avx2(auVar33,local_300);
            auVar4._8_8_ = lStack_278;
            auVar4._0_8_ = local_280;
            auVar4._16_8_ = lStack_270;
            auVar4._24_8_ = lStack_268;
            auVar33 = vpcmpgtq_avx2(local_320,auVar4);
            auVar30 = vpor_avx2(auVar30,auVar33);
            if ((((auVar30 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 SUB321(auVar30 >> 0x7f,0) != '\0') || SUB321(auVar30 >> 0xbf,0) != '\0') ||
                auVar30[0x1f] < '\0') {
              *(byte *)&ppVar7->flag = (byte)ppVar7->flag | 0x40;
              lVar11 = 0;
              iVar23 = 0;
              iVar10 = 0;
            }
            ppVar7->score = (int)lVar11;
            ppVar7->end_query = iVar10;
            ppVar7->end_ref = iVar23;
            parasail_free(ptr_00);
            parasail_free(ptr_02);
            parasail_free(ptr);
            if (matrix->type == 0) {
              parasail_free(ptr_01);
              return ppVar7;
            }
            return ppVar7;
          }
        }
        return (parasail_result_t *)0x0;
      }
      if (_s1 == (char *)0x0) {
        __format = "%s: missing %s\n";
        pcVar14 = "_s1";
      }
      else {
        if (0 < _s1Len) goto LAB_00802824;
        __format = "%s: %s must be > 0\n";
        pcVar14 = "_s1Len";
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sw_trace_diag_avx2_256_64",pcVar14);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int64_t * restrict s1 = NULL;
    int64_t * restrict s2B = NULL;
    int64_t * restrict _H_pr = NULL;
    int64_t * restrict _F_pr = NULL;
    int64_t * restrict s2 = NULL;
    int64_t * restrict H_pr = NULL;
    int64_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInf;
    __m256i vNegInf0;
    __m256i vOpen;
    __m256i vGap;
    __m256i vZero;
    __m256i vOne;
    __m256i vN;
    __m256i vNegOne;
    __m256i vI;
    __m256i vJreset;
    __m256i vMaxH;
    __m256i vEndI;
    __m256i vEndJ;
    __m256i vILimit;
    __m256i vJLimit;
    __m256i vTDiag;
    __m256i vTIns;
    __m256i vTDel;
    __m256i vTZero;
    __m256i vTDiagE;
    __m256i vTInsE;
    __m256i vTDiagF;
    __m256i vTDelF;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }
        
    /* initialize stack variables */
    N = 4; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vNegInf0 = _mm256_srli_si256_rpl(vNegInf, 8); /* shift in a 0 */
    vOpen = _mm256_set1_epi64x_rpl(open);
    vGap  = _mm256_set1_epi64x_rpl(gap);
    vZero = _mm256_set1_epi64x_rpl(0);
    vOne = _mm256_set1_epi64x_rpl(1);
    vN = _mm256_set1_epi64x_rpl(N);
    vNegOne = _mm256_set1_epi64x_rpl(-1);
    vI = _mm256_set_epi64x_rpl(0,1,2,3);
    vJreset = _mm256_set_epi64x_rpl(0,-1,-2,-3);
    vMaxH = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm256_set1_epi64x_rpl(s1Len);
    vJLimit = _mm256_set1_epi64x_rpl(s2Len);
    vTDiag = _mm256_set1_epi64x_rpl(PARASAIL_DIAG);
    vTIns = _mm256_set1_epi64x_rpl(PARASAIL_INS);
    vTDel = _mm256_set1_epi64x_rpl(PARASAIL_DEL);
    vTZero = _mm256_set1_epi64x_rpl(PARASAIL_ZERO);
    vTDiagE = _mm256_set1_epi64x_rpl(PARASAIL_DIAG_E);
    vTInsE = _mm256_set1_epi64x_rpl(PARASAIL_INS_E);
    vTDiagF = _mm256_set1_epi64x_rpl(PARASAIL_DIAG_F);
    vTDelF = _mm256_set1_epi64x_rpl(PARASAIL_DEL_F);

    /* initialize result */
    result = parasail_result_new_trace(s1Len, s2Len, 32, sizeof(int8_t));
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_TRACE
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;

    /* initialize heap variables */
    s2B= parasail_memalign_int64_t(32, s2Len+PAD2);
    _H_pr = parasail_memalign_int64_t(32, s2Len+PAD2);
    _F_pr = parasail_memalign_int64_t(32, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int64_t(32, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m256i vNH = vNegInf0;
        __m256i vWH = vNegInf0;
        __m256i vE = vNegInf;
        __m256i vE_opn = vNegInf;
        __m256i vE_ext = vNegInf;
        __m256i vF = vNegInf;
        __m256i vF_opn = vNegInf;
        __m256i vF_ext = vNegInf;
        __m256i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        __m256i vIltLimit = _mm256_cmplt_epi64_rpl(vI, vILimit);
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m256i vMat;
            __m256i vNWH = vNH;
            vNH = _mm256_srli_si256_rpl(vWH, 8);
            vNH = _mm256_insert_epi64_rpl(vNH, H_pr[j], 3);
            vF = _mm256_srli_si256_rpl(vF, 8);
            vF = _mm256_insert_epi64_rpl(vF, F_pr[j], 3);
            vF_opn = _mm256_sub_epi64(vNH, vOpen);
            vF_ext = _mm256_sub_epi64(vF, vGap);
            vF = _mm256_max_epi64_rpl(vF_opn, vF_ext);
            vE_opn = _mm256_sub_epi64(vWH, vOpen);
            vE_ext = _mm256_sub_epi64(vE, vGap);
            vE = _mm256_max_epi64_rpl(vE_opn, vE_ext);
            vMat = _mm256_set_epi64x_rpl(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]]
                    );
            vNWH = _mm256_add_epi64(vNWH, vMat);
            vNWH = _mm256_max_epi64_rpl(vNWH, vZero);
            vWH = _mm256_max_epi64_rpl(vNWH, vE);
            vWH = _mm256_max_epi64_rpl(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m256i cond = _mm256_cmpeq_epi64(vJ,vNegOne);
                vWH = _mm256_andnot_si256(cond, vWH);
                vF = _mm256_blendv_epi8(vF, vNegInf, cond);
                vE = _mm256_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vWH);
            }
            /* trace table */
            {
                __m256i cond_zero = _mm256_cmpeq_epi64(vWH, vZero);
                __m256i case1 = _mm256_cmpeq_epi64(vWH, vNWH);
                __m256i case2 = _mm256_cmpeq_epi64(vWH, vF);
                __m256i vT = _mm256_blendv_epi8(
                        _mm256_blendv_epi8(vTIns, vTDel, case2),
                        _mm256_blendv_epi8(vTDiag, vTZero, cond_zero),
                        case1);
                __m256i condE = _mm256_cmpgt_epi64(vE_opn, vE_ext);
                __m256i condF = _mm256_cmpgt_epi64(vF_opn, vF_ext);
                __m256i vET = _mm256_blendv_epi8(vTInsE, vTDiagE, condE);
                __m256i vFT = _mm256_blendv_epi8(vTDelF, vTDiagF, condF);
                vT = _mm256_or_si256(vT, vET);
                vT = _mm256_or_si256(vT, vFT);
                arr_store_si256(result->trace->trace_table, vT, i, s1Len, j, s2Len);
            }
            H_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vWH,0);
            F_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vF,0);
            /* as minor diagonal vector passes across table, extract
             * max values within the i,j bounds */
            {
                __m256i cond_valid_J = _mm256_and_si256(
                        _mm256_cmpgt_epi64(vJ, vNegOne),
                        _mm256_cmplt_epi64_rpl(vJ, vJLimit));
                __m256i cond_valid_IJ = _mm256_and_si256(cond_valid_J, vIltLimit);
                __m256i cond_eq = _mm256_cmpeq_epi64(vWH, vMaxH);
                __m256i cond_max = _mm256_cmpgt_epi64(vWH, vMaxH);
                __m256i cond_all = _mm256_and_si256(cond_max, cond_valid_IJ);
                __m256i cond_Jlt = _mm256_cmplt_epi64_rpl(vJ, vEndJ);
                vMaxH = _mm256_blendv_epi8(vMaxH, vWH, cond_all);
                vEndI = _mm256_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm256_blendv_epi8(vEndJ, vJ, cond_all);
                cond_all = _mm256_and_si256(cond_Jlt, cond_eq);
                cond_all = _mm256_and_si256(cond_all, cond_valid_IJ);
                vEndI = _mm256_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm256_blendv_epi8(vEndJ, vJ, cond_all);
            }
            vJ = _mm256_add_epi64(vJ, vOne);
        }
        vI = _mm256_add_epi64(vI, vN);
    }

    /* alignment ending position */
    {
        int64_t *t = (int64_t*)&vMaxH;
        int64_t *i = (int64_t*)&vEndI;
        int64_t *j = (int64_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++t, ++i, ++j) {
            if (*t > score) {
                score = *t;
                end_query = *i;
                end_ref = *j;
            }
            else if (*t == score) {
                if (*j < end_ref) {
                    end_query = *i;
                    end_ref = *j;
                }
                else if (*j == end_ref && *i < end_query) {
                    end_query = *i;
                    end_ref = *j;
                }
            }
        }
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}